

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

char * ndiHexEncode(char *cp,void *data,int n)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  byte *local_40;
  char *tcp;
  uint d;
  int c2;
  int c1;
  int i;
  uchar *bdata;
  int n_local;
  void *data_local;
  char *cp_local;
  
  local_40 = (byte *)cp;
  for (c2 = 0; c2 < n; c2 = c2 + 1) {
    bVar1 = *(byte *)((long)data + (long)c2) >> 4;
    bVar2 = *(byte *)((long)data + (long)c2) & 0xf;
    d._0_1_ = bVar1 + 0x30;
    bVar3 = bVar2 + 0x30;
    if (0x39 < (byte)d) {
      d._0_1_ = bVar1 + 0x37;
    }
    if (0x39 < bVar3) {
      bVar3 = bVar2 + 0x37;
    }
    pbVar4 = local_40 + 1;
    *local_40 = (byte)d;
    local_40 = local_40 + 2;
    *pbVar4 = bVar3;
  }
  return cp;
}

Assistant:

ndicapiExport char* ndiHexEncode(char* cp, const void* data, int n)
{
  const unsigned char* bdata;
  int i, c1, c2;
  unsigned int d;
  char* tcp;

  bdata = (const unsigned char*)data;
  tcp = cp;

  for (i = 0; i < n; i++)
  {
    d = bdata[i];
    c1 = (d & 0xf0) >> 4;
    c2 = (d & 0x0f);
    c1 += '0';
    c2 += '0';
    if (c1 > '9')
    {
      c1 += ('A' - '0' - 10);
    }
    if (c2 > '9')
    {
      c2 += ('A' - '0' - 10);
    }
    *tcp++ = c1;
    *tcp++ = c2;
  }

  return cp;
}